

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,int *nonz,int n)

{
  fpclass_type fVar1;
  fpclass_type fVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  int *piVar21;
  byte bVar22;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int local_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [13];
  undefined3 uStack_29b;
  int iStack_298;
  bool bStack_294;
  undefined8 local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  int *local_280;
  pointer local_278;
  int *local_270;
  int *local_268;
  int *local_260;
  long local_258;
  long local_250;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  long local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  fpclass_type local_140;
  int32_t iStack_13c;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar22 = 0;
  local_270 = nonz;
  local_288 = vec;
  local_248 = eps;
  local_1b8._0_16_ = (undefined1  [16])0x0;
  local_1b8._16_16_ = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = SUB1613((undefined1  [16])0x0,0);
  uStack_14b = 0;
  local_1c0._0_4_ = cpp_dec_float_finite;
  local_1c0._4_4_ = 0x1c;
  local_238._0_16_ = (undefined1  [16])0x0;
  local_238._16_16_ = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_1cb = 0;
  iStack_1c8 = 0;
  bStack_1c4 = false;
  iVar9 = (this->l).firstUpdate;
  iVar11 = (this->l).firstUnused;
  local_258 = (long)iVar9;
  local_30c = n;
  if (iVar9 < iVar11) {
    local_278 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_280 = (this->l).idx;
    local_260 = (this->l).row;
    local_268 = (this->l).start;
    lVar14 = (long)iVar11;
    do {
      iVar9 = local_260[lVar14 + -1];
      pnVar16 = local_288 + iVar9;
      puVar19 = (uint *)local_1b8;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar19 = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
      }
      iStack_148 = local_288[iVar9].m_backend.exp;
      bStack_144 = local_288[iVar9].m_backend.neg;
      fVar1 = local_288[iVar9].m_backend.fpclass;
      iVar4 = local_288[iVar9].m_backend.prec_elem;
      local_140 = fVar1;
      iStack_13c = iVar4;
      local_250 = lVar14 + -1;
      if (fVar1 == cpp_dec_float_NaN) {
LAB_00549344:
        lVar13 = (long)local_268[lVar14 + -1];
        iVar9 = local_268[lVar14];
        if (local_268[lVar14 + -1] < iVar9) {
          piVar21 = local_280 + lVar13;
          pcVar15 = &local_278[lVar13].m_backend;
          local_240 = lVar13;
          do {
            iVar11 = *piVar21;
            pnVar16 = local_288 + iVar11;
            pnVar18 = pnVar16;
            puVar19 = (uint *)local_238;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar19 = (pnVar18->m_backend).data._M_elems[0];
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
              puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
            }
            iStack_1c8 = local_288[iVar11].m_backend.exp;
            bStack_1c4 = local_288[iVar11].m_backend.neg;
            fVar2 = local_288[iVar11].m_backend.fpclass;
            iVar5 = local_288[iVar11].m_backend.prec_elem;
            local_1c0._0_4_ = fVar2;
            local_1c0._4_4_ = iVar5;
            if (fVar2 == cpp_dec_float_NaN) {
LAB_005493f0:
              local_290._0_4_ = cpp_dec_float_finite;
              local_290._4_4_ = 0x1c;
              local_308 = (undefined1  [16])0x0;
              local_2f8 = (undefined1  [16])0x0;
              local_2e8 = (undefined1  [16])0x0;
              local_2d8 = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              local_2a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_29b = 0;
              iStack_298 = 0;
              bStack_294 = false;
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
              if (pcVar15 != (cpp_dec_float<200U,_int,_void> *)local_308) {
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_308;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                  pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar17 + (ulong)bVar22 * -8 + 4);
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar20 + (ulong)bVar22 * -8 + 4);
                }
                iStack_298 = iStack_148;
                bStack_294 = bStack_144;
                local_290._0_4_ = local_140;
                local_290._4_4_ = iStack_13c;
                pcVar17 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_308,pcVar17);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_238,
                         (cpp_dec_float<200U,_int,_void> *)local_308);
              if ((fpclass_type)local_1c0 == cpp_dec_float_NaN) {
LAB_005494cc:
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_238;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_308;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                  pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar17 + (ulong)bVar22 * -8 + 4);
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar20 + (ulong)bVar22 * -8 + 4);
                }
                iStack_298 = iStack_1c8;
                bStack_294 = bStack_1c4;
                local_290._0_4_ = (fpclass_type)local_1c0;
                local_290._4_4_ = local_1c0._4_4_;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_308,0,(type *)0x0);
                iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_238,
                                    (cpp_dec_float<200U,_int,_void> *)local_308);
                if (iVar11 != 0) goto LAB_005494cc;
                local_290._0_4_ = cpp_dec_float_finite;
                local_290._4_4_ = 0x1c;
                local_308 = (undefined1  [16])0x0;
                local_2f8 = (undefined1  [16])0x0;
                local_2e8 = (undefined1  [16])0x0;
                local_2d8 = (undefined1  [16])0x0;
                local_2c8 = (undefined1  [16])0x0;
                local_2b8 = (undefined1  [16])0x0;
                local_2a8 = SUB1613((undefined1  [16])0x0,0);
                uStack_29b = 0;
                iStack_298 = 0;
                bStack_294 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_308,1e-100);
              }
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_308;
              pnVar18 = pnVar16;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pnVar18->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4)
                ;
                pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              (pnVar16->m_backend).exp = iStack_298;
              (pnVar16->m_backend).neg = bStack_294;
              (pnVar16->m_backend).fpclass = (fpclass_type)local_290;
              (pnVar16->m_backend).prec_elem = local_290._4_4_;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_308,0,(type *)0x0);
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_238,
                                  (cpp_dec_float<200U,_int,_void> *)local_308);
              iVar12 = iStack_148;
              if (iVar10 != 0) goto LAB_005493f0;
              puVar19 = (uint *)local_1b8;
              pcVar17 = &local_130;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar17->data)._M_elems[0] = *puVar19;
                puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              local_130.exp = iStack_148;
              local_130.neg = bStack_144;
              fVar7 = local_140;
              local_130.fpclass = local_140;
              iVar8 = iStack_13c;
              local_130.prec_elem = iStack_13c;
              if (local_130.data._M_elems[0] != 0 || local_140 != cpp_dec_float_finite) {
                local_130.neg = (bool)(bStack_144 ^ 1);
              }
              local_290._0_4_ = cpp_dec_float_finite;
              local_290._4_4_ = 0x1c;
              local_308 = (undefined1  [16])0x0;
              local_2f8 = (undefined1  [16])0x0;
              local_2e8 = (undefined1  [16])0x0;
              local_2d8 = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              local_2a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_29b = 0;
              iStack_298 = 0;
              bStack_294 = false;
              pcVar17 = &local_130;
              if (pcVar15 != (cpp_dec_float<200U,_int,_void> *)local_308) {
                puVar19 = (uint *)local_1b8;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_308;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar17->data)._M_elems[0] = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
                  pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar17 + (ulong)bVar22 * -8 + 4);
                }
                iStack_298 = iVar12;
                bStack_294 = local_130.neg;
                local_290._0_4_ = fVar7;
                local_290._4_4_ = iVar8;
                pcVar17 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_308,pcVar17);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_308;
              puVar19 = (uint *)local_238;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar19 = (pcVar17->data)._M_elems[0];
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4)
                ;
                puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
              }
              iStack_1c8 = iStack_298;
              bStack_1c4 = bStack_294;
              local_1c0._0_4_ = (fpclass_type)local_290;
              local_1c0._4_4_ = local_290._4_4_;
              puVar19 = (uint *)local_238;
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_308;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar17->data)._M_elems[0] = *puVar19;
                puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4)
                ;
              }
              pnVar18 = local_248;
              pcVar17 = &local_b0;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar17->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
                pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              local_b0.exp = (local_248->m_backend).exp;
              local_b0.neg = (local_248->m_backend).neg;
              fVar3 = (local_248->m_backend).fpclass;
              iVar6 = (local_248->m_backend).prec_elem;
              local_b0.fpclass = fVar3;
              local_b0.prec_elem = iVar6;
              if ((bStack_294 == true) &&
                 (local_308._0_4_ != 0 || (fpclass_type)local_290 != cpp_dec_float_finite)) {
                bStack_294 = false;
              }
              if ((fVar3 != cpp_dec_float_NaN && (fpclass_type)local_290 != cpp_dec_float_NaN) &&
                 (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_308,&local_b0),
                 0 < iVar12)) {
                puVar19 = (uint *)local_238;
                pnVar18 = pnVar16;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pnVar18->m_backend).data._M_elems[0] = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
                  pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
                }
                (pnVar16->m_backend).exp = iStack_1c8;
                (pnVar16->m_backend).neg = bStack_1c4;
                (pnVar16->m_backend).fpclass = (fpclass_type)local_1c0;
                (pnVar16->m_backend).prec_elem = local_1c0._4_4_;
                lVar14 = (long)local_30c;
                local_30c = local_30c + 1;
                local_270[lVar14] = iVar11;
              }
            }
            piVar21 = piVar21 + 1;
            pcVar15 = pcVar15 + 1;
            iVar9 = iVar9 + -1;
          } while ((int)local_240 < iVar9);
        }
      }
      else {
        local_290._0_4_ = cpp_dec_float_finite;
        local_290._4_4_ = 0x1c;
        local_308 = (undefined1  [16])0x0;
        local_2f8 = (undefined1  [16])0x0;
        local_2e8 = (undefined1  [16])0x0;
        local_2d8 = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_2b8 = (undefined1  [16])0x0;
        local_2a8 = SUB1613((undefined1  [16])0x0,0);
        uStack_29b = 0;
        iStack_298 = 0;
        bStack_294 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_308,0.0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_1b8,
                           (cpp_dec_float<200U,_int,_void> *)local_308);
        if (iVar9 != 0) goto LAB_00549344;
      }
      lVar14 = local_250;
    } while (local_258 < local_250);
  }
  return local_30c;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}